

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::set_comparator_type(CVmObjDict *this,vm_obj_id_t obj)

{
  int iVar1;
  vm_dict_ext *pvVar2;
  int in_ESI;
  CVmObjDict *in_RDI;
  CVmObject *local_20;
  
  if (in_ESI == 0) {
    pvVar2 = get_ext(in_RDI);
    pvVar2->comparator_type_ = VMDICT_COMP_NONE;
  }
  else {
    iVar1 = CVmObjStrComp::is_strcmp_obj(0);
    if (iVar1 == 0) {
      pvVar2 = get_ext(in_RDI);
      pvVar2->comparator_type_ = VMDICT_COMP_GENERIC;
    }
    else {
      pvVar2 = get_ext(in_RDI);
      pvVar2->comparator_type_ = VMDICT_COMP_STRCOMP;
    }
  }
  if (in_ESI == 0) {
    local_20 = (CVmObject *)0x0;
  }
  else {
    local_20 = vm_objp(0);
  }
  pvVar2 = get_ext(in_RDI);
  pvVar2->comparator_obj_ = local_20;
  return;
}

Assistant:

void CVmObjDict::set_comparator_type(VMG_ vm_obj_id_t obj)
{
    /* check what kind of object we have */
    if (obj == VM_INVALID_OBJ)
    {
        /* there's no comparator at all, so simply use an exact comparison */
        get_ext()->comparator_type_ = VMDICT_COMP_NONE;
    }
    else if (CVmObjStrComp::is_strcmp_obj(vmg_ obj))
    {
        /* it's a StringComparator */
        get_ext()->comparator_type_ = VMDICT_COMP_STRCOMP;
    }
    else
    {
        /* it's a generic comparator object */
        get_ext()->comparator_type_ = VMDICT_COMP_GENERIC;
    }